

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::SocketWriter::MakeConnection(SocketWriter *this)

{
  bool bVar1;
  int __ecode;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  char *__service;
  long in_RDI;
  addrinfo *cur_addr;
  int error_num;
  addrinfo *servinfo;
  addrinfo hints;
  GTestLog *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  GTestLogSeverity severity;
  addrinfo *paVar5;
  GTestLog in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  addrinfo *local_58;
  addrinfo local_50;
  GTestLog local_c [3];
  
  severity = (GTestLogSeverity)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  bVar1 = IsTrue(*(int *)(in_RDI + 8) == -1);
  if (!bVar1) {
    GTestLog::GTestLog((GTestLog *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0.severity_),
                       severity,in_stack_ffffffffffffff90,(int)((ulong)in_RDI >> 0x20));
    poVar3 = GTestLog::GetStream(local_c);
    poVar3 = std::operator<<(poVar3,"Condition sockfd_ == -1 failed. ");
    std::operator<<(poVar3,"MakeConnection() can\'t be called when there is already a connection.");
    GTestLog::~GTestLog(in_stack_ffffffffffffff20);
  }
  memset(&local_50,0,0x30);
  local_50.ai_family = 0;
  local_50.ai_socktype = 1;
  local_58 = (addrinfo *)0x0;
  pcVar4 = (char *)std::__cxx11::string::c_str();
  __service = (char *)std::__cxx11::string::c_str();
  __ecode = getaddrinfo(pcVar4,__service,&local_50,&local_58);
  paVar5 = local_58;
  if (__ecode != 0) {
    GTestLog::GTestLog((GTestLog *)CONCAT44(__ecode,in_stack_ffffffffffffffa0.severity_),severity,
                       in_stack_ffffffffffffff90,(int)((ulong)in_RDI >> 0x20));
    poVar3 = GTestLog::GetStream((GTestLog *)&stack0xffffffffffffffa0);
    poVar3 = std::operator<<(poVar3,"stream_result_to: getaddrinfo() failed: ");
    pcVar4 = gai_strerror(__ecode);
    std::operator<<(poVar3,pcVar4);
    GTestLog::~GTestLog(in_stack_ffffffffffffff20);
    paVar5 = local_58;
  }
  for (; *(int *)(in_RDI + 8) == -1 && paVar5 != (addrinfo *)0x0; paVar5 = paVar5->ai_next) {
    iVar2 = socket(paVar5->ai_family,paVar5->ai_socktype,paVar5->ai_protocol);
    *(int *)(in_RDI + 8) = iVar2;
    if ((*(int *)(in_RDI + 8) != -1) &&
       (iVar2 = connect(*(int *)(in_RDI + 8),paVar5->ai_addr,paVar5->ai_addrlen), iVar2 == -1)) {
      close(*(int *)(in_RDI + 8));
      *(undefined4 *)(in_RDI + 8) = 0xffffffff;
    }
  }
  freeaddrinfo(local_58);
  if (*(int *)(in_RDI + 8) == -1) {
    GTestLog::GTestLog((GTestLog *)CONCAT44(__ecode,in_stack_ffffffffffffffa0.severity_),
                       (GTestLogSeverity)((ulong)paVar5 >> 0x20),in_stack_ffffffffffffff90,
                       (int)((ulong)in_RDI >> 0x20));
    poVar3 = GTestLog::GetStream((GTestLog *)&stack0xffffffffffffff94);
    poVar3 = std::operator<<(poVar3,"stream_result_to: failed to connect to ");
    poVar3 = std::operator<<(poVar3,(string *)(in_RDI + 0x10));
    poVar3 = std::operator<<(poVar3,":");
    std::operator<<(poVar3,(string *)(in_RDI + 0x30));
    GTestLog::~GTestLog((GTestLog *)poVar3);
  }
  return;
}

Assistant:

void StreamingListener::SocketWriter::MakeConnection() {
  GTEST_CHECK_(sockfd_ == -1)
      << "MakeConnection() can't be called when there is already a connection.";

  addrinfo hints;
  memset(&hints, 0, sizeof(hints));
  hints.ai_family = AF_UNSPEC;    // To allow both IPv4 and IPv6 addresses.
  hints.ai_socktype = SOCK_STREAM;
  addrinfo* servinfo = NULL;

  // Use the getaddrinfo() to get a linked list of IP addresses for
  // the given host name.
  const int error_num = getaddrinfo(
      host_name_.c_str(), port_num_.c_str(), &hints, &servinfo);
  if (error_num != 0) {
    GTEST_LOG_(WARNING) << "stream_result_to: getaddrinfo() failed: "
                        << gai_strerror(error_num);
  }

  // Loop through all the results and connect to the first we can.
  for (addrinfo* cur_addr = servinfo; sockfd_ == -1 && cur_addr != NULL;
       cur_addr = cur_addr->ai_next) {
    sockfd_ = socket(
        cur_addr->ai_family, cur_addr->ai_socktype, cur_addr->ai_protocol);
    if (sockfd_ != -1) {
      // Connect the client socket to the server socket.
      if (connect(sockfd_, cur_addr->ai_addr, cur_addr->ai_addrlen) == -1) {
        close(sockfd_);
        sockfd_ = -1;
      }
    }
  }

  freeaddrinfo(servinfo);  // all done with this structure

  if (sockfd_ == -1) {
    GTEST_LOG_(WARNING) << "stream_result_to: failed to connect to "
                        << host_name_ << ":" << port_num_;
  }
}